

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::mouseReleaseEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  int iVar1;
  State SVar2;
  ulong uVar3;
  QStyle *pQVar4;
  undefined4 in_ECX;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  auVar11 = QEventPoint::position();
  auVar10._0_8_ =
       (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_;
  auVar10._8_8_ =
       (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._0_8_;
  auVar10 = minpd(_DAT_0066f5d0,auVar10);
  auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
  auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
  uVar5 = movmskpd(in_ECX,auVar11);
  uVar7 = (ulong)(uint)(int)auVar10._8_8_;
  uVar3 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
  if ((uVar5 & 1) == 0) {
    uVar3 = 0x8000000000000000;
  }
  if ((uVar5 & 2) == 0) {
    uVar7 = 0x80000000;
  }
  local_38 = (QPoint)(uVar7 | uVar3);
  iVar1 = QTreeViewPrivate::itemDecorationAt(this_00,&local_38);
  if (iVar1 == -1) {
    QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,event);
    goto LAB_005af106;
  }
  SVar2 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar2 == DragSelectingState) {
LAB_005af057:
    QAbstractItemView::setState((QAbstractItemView *)this,NoState);
  }
  else {
    SVar2 = QAbstractItemView::state((QAbstractItemView *)this);
    if (SVar2 == DraggingState) goto LAB_005af057;
  }
  pQVar4 = QWidget::style((QWidget *)this);
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x28,0,this,0);
  uVar6 = SUB84(this,0);
  if (iVar1 == 3) {
    auVar10 = QEventPoint::position();
    auVar8._0_8_ = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._8_8_;
    auVar8._8_8_ = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar10._0_8_;
    auVar10 = minpd(_DAT_0066f5d0,auVar8);
    auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
    auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
    uVar5 = movmskpd(uVar6,auVar9);
    uVar3 = 0x8000000000000000;
    if ((uVar5 & 1) != 0) {
      uVar3 = (ulong)(uint)(int)auVar10._0_8_ << 0x20;
    }
    uVar7 = 0x80000000;
    if ((uVar5 & 2) != 0) {
      uVar7 = (ulong)(uint)(int)auVar10._8_8_;
    }
    local_38 = (QPoint)(uVar7 | uVar3);
    QTreeViewPrivate::expandOrCollapseItemAtPos(this_00,&local_38);
  }
LAB_005af106:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (d->itemDecorationAt(event->position().toPoint()) == -1) {
        QAbstractItemView::mouseReleaseEvent(event);
    } else {
        if (state() == QAbstractItemView::DragSelectingState || state() == QAbstractItemView::DraggingState)
            setState(QAbstractItemView::NoState);
        if (style()->styleHint(QStyle::SH_ListViewExpand_SelectMouseType, nullptr, this) == QEvent::MouseButtonRelease)
            d->expandOrCollapseItemAtPos(event->position().toPoint());
    }
}